

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-constant.h
# Opt level: O2

bool __thiscall
wasm::PossibleConstantValues::combine(PossibleConstantValues *this,PossibleConstantValues *other)

{
  __index_type _Var1;
  bool bVar2;
  _Storage<wasm::HeapType,_true> a;
  HeapType b;
  optional<wasm::HeapType> oVar3;
  Literal local_38;
  
  if ((*(__index_type *)
        ((long)&(other->value).
                super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                .
                super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                .
                super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                .
                super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                .
                super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                .
                super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
        + 0x18) == '\0') ||
     (_Var1 = *(__index_type *)
               ((long)&(this->value).
                       super__Variant_base<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       .
                       super__Move_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       .
                       super__Copy_assign_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       .
                       super__Move_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       .
                       super__Copy_ctor_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                       .
                       super__Variant_storage_alias<wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
               + 0x18), _Var1 == '\x03')) {
LAB_0094e419:
    bVar2 = false;
  }
  else {
    if (_Var1 == '\0') {
      std::__detail::__variant::
      _Copy_assign_base<false,_wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
      ::operator=((_Copy_assign_base<false,_wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                   *)this,(_Copy_assign_base<false,_wasm::PossibleConstantValues::None,_wasm::Literal,_wasm::Name,_wasm::PossibleConstantValues::Many>
                           *)other);
    }
    else {
      bVar2 = std::operator!=(&other->value,&this->value);
      if (!bVar2) {
        bVar2 = isNull(this);
        if (bVar2) {
          bVar2 = isNull(other);
          if (bVar2) {
            getConstantLiteral(&local_38,this);
            a._M_value = wasm::Type::getHeapType(&local_38.type);
            Literal::~Literal(&local_38);
            getConstantLiteral(&local_38,other);
            b = wasm::Type::getHeapType(&local_38.type);
            Literal::~Literal(&local_38);
            oVar3 = HeapType::getLeastUpperBound(a._M_value,b);
            if (((undefined1  [16])
                 oVar3.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) goto LAB_0094e39a;
            if (oVar3.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload != a) {
              Literal::makeNull(&local_38,
                                oVar3.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                                super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
              std::
              variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
              ::operator=((variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                           *)this,&local_38);
              Literal::~Literal(&local_38);
              goto LAB_0094e3a6;
            }
          }
        }
        goto LAB_0094e419;
      }
LAB_0094e39a:
      std::
      variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
      ::operator=((variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                   *)this,(Many *)&local_38);
    }
LAB_0094e3a6:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool combine(const PossibleConstantValues& other) {
    if (std::get_if<None>(&other.value)) {
      return false;
    }

    if (std::get_if<None>(&value)) {
      value = other.value;
      return true;
    }

    if (std::get_if<Many>(&value)) {
      return false;
    }

    if (other.value != value) {
      value = Many();
      return true;
    }

    // Nulls compare equal, and we could consider any of the input nulls as the
    // combination of the two (as any of them would be valid to place in the
    // location we are working to optimize). In order to have simple symmetric
    // behavior here, which does not depend on the order of the inputs, use the
    // LUB.
    if (isNull() && other.isNull()) {
      auto type = getConstantLiteral().type.getHeapType();
      auto otherType = other.getConstantLiteral().type.getHeapType();
      auto lub = HeapType::getLeastUpperBound(type, otherType);
      if (!lub) {
        // TODO: Remove this workaround once we have bottom types to assign to
        // null literals.
        value = Many();
        return true;
      }
      if (*lub != type) {
        value = Literal::makeNull(*lub);
        return true;
      }
      return false;
    }

    return false;
  }